

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O2

void __thiscall
TEST_TestMemoryAccountant_reportWithCacheSizesEmpty_TestShell::
TEST_TestMemoryAccountant_reportWithCacheSizesEmpty_TestShell
          (TEST_TestMemoryAccountant_reportWithCacheSizesEmpty_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_0038c228;
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportWithCacheSizesEmpty)
{
    size_t cacheSizes[] = {0};

    accountant.useCacheSizes(cacheSizes, 0);
    accountant.alloc(4);

    STRCMP_EQUAL("CppUTest Memory Accountant report (with cache sizes):\n"
                 "Cache size          # allocations    # deallocations   max # allocations at one time\n"
                 "other                   1                0                 1\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}